

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int n;
  char *s;
  memory_buf_t *dest_00;
  string_view_t view;
  basic_string_view<char> local_48;
  char local_34 [3];
  null_scoped_padder local_31;
  undefined8 uStack_30;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  r_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  uStack_30 = 0xb;
  dest_00 = dest;
  null_scoped_padder::null_scoped_padder(&local_31,0xb,&(this->super_flag_formatter).padinfo_,dest);
  n = to12h(tm_time);
  fmt_helper::pad2(n,dest);
  local_34[2] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_34 + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_34[1] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_34 + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_34[0] = ' ';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_34);
  s = ampm(tm_time);
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_48,s);
  view.size_ = (size_t)dest;
  view.data_ = (char *)local_48.size_;
  fmt_helper::append_string_view((fmt_helper *)local_48.data_,view,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }